

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

void __thiscall Character::DropAll(Character *this,Character *killer)

{
  short sVar1;
  EIF *this_00;
  Map *pMVar2;
  World *pWVar3;
  bool bVar4;
  uint uVar5;
  int num;
  pointer pCVar6;
  iterator pvVar7;
  EIF_Data *pEVar8;
  element_type *peVar9;
  mapped_type *pmVar10;
  double dVar11;
  double dVar12;
  undefined1 local_1c0 [8];
  PacketBuilder builder_1;
  PacketBuilder builder_2;
  int subloc;
  allocator<char> local_131;
  key_type local_130;
  undefined1 local_110 [8];
  shared_ptr<Map_Item> map_item_1;
  value_type_conflict1 id;
  iterator __end1;
  iterator __begin1;
  array<int,_15UL> *__range1;
  _List_const_iterator<Character_Item> _Stack_d8;
  int i;
  _List_node_base *local_d0;
  undefined1 local_c8 [8];
  PacketBuilder builder;
  key_type local_90;
  allocator<char> local_69;
  key_type local_68;
  undefined1 local_38 [8];
  shared_ptr<Map_Item> map_item;
  _Self local_20;
  iterator it;
  Character *killer_local;
  Character *this_local;
  
  it._M_node = (_List_node_base *)killer;
  bVar4 = CanInteractItems(this);
  if (bVar4) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::begin
                   (&this->inventory);
    while( true ) {
      map_item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::end
                     (&this->inventory);
      bVar4 = std::operator!=(&local_20,
                              (_Self *)&map_item.
                                        super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount);
      if (!bVar4) break;
      this_00 = this->world->eif;
      pCVar6 = std::_List_iterator<Character_Item>::operator->(&local_20);
      pEVar8 = EIF::Get(this_00,(int)pCVar6->id);
      if (pEVar8->special == Lore) {
        std::_List_iterator<Character_Item>::operator++(&local_20);
      }
      else {
        pMVar2 = this->player->character->map;
        pCVar6 = std::_List_iterator<Character_Item>::operator->(&local_20);
        sVar1 = pCVar6->id;
        pCVar6 = std::_List_iterator<Character_Item>::operator->(&local_20);
        Map::AddItem((Map *)local_38,(short)pMVar2,(int)sVar1,(uchar)pCVar6->amount,this->x,
                     (Character *)(ulong)this->y);
        bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
        if (bVar4) {
          if (it._M_node == (_List_node_base *)0x0) {
            uVar5 = PlayerID(this);
            peVar9 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_38);
            peVar9->owner = uVar5;
            dVar11 = Timer::GetTime();
            pWVar3 = this->world;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_90,"ProtectDeathDrop",
                       (allocator<char> *)((long)&builder.add_size + 7));
            pmVar10 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                      ::operator[](&(pWVar3->config).
                                    super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                   ,&local_90);
            dVar12 = util::variant::operator_cast_to_double(pmVar10);
            peVar9 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_38);
            peVar9->unprotecttime = dVar11 + dVar12;
            std::__cxx11::string::~string((string *)&local_90);
            std::allocator<char>::~allocator((allocator<char> *)((long)&builder.add_size + 7));
          }
          else {
            uVar5 = PlayerID((Character *)it._M_node);
            peVar9 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_38);
            peVar9->owner = uVar5;
            dVar11 = Timer::GetTime();
            pWVar3 = this->world;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_68,"ProtectPKDrop",&local_69);
            pmVar10 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                      ::operator[](&(pWVar3->config).
                                    super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                   ,&local_68);
            dVar12 = util::variant::operator_cast_to_double(pmVar10);
            peVar9 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_38);
            peVar9->unprotecttime = dVar11 + dVar12;
            std::__cxx11::string::~string((string *)&local_68);
            std::allocator<char>::~allocator(&local_69);
          }
          PacketBuilder::PacketBuilder((PacketBuilder *)local_c8,PACKET_ITEM,PACKET_DROP,0xf);
          pCVar6 = std::_List_iterator<Character_Item>::operator->(&local_20);
          PacketBuilder::AddShort((PacketBuilder *)local_c8,(int)pCVar6->id);
          pCVar6 = std::_List_iterator<Character_Item>::operator->(&local_20);
          PacketBuilder::AddThree((PacketBuilder *)local_c8,pCVar6->amount);
          PacketBuilder::AddInt((PacketBuilder *)local_c8,0);
          peVar9 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_38);
          PacketBuilder::AddShort((PacketBuilder *)local_c8,(int)peVar9->uid);
          PacketBuilder::AddChar((PacketBuilder *)local_c8,(uint)this->x);
          PacketBuilder::AddChar((PacketBuilder *)local_c8,(uint)this->y);
          PacketBuilder::AddChar((PacketBuilder *)local_c8,this->weight);
          PacketBuilder::AddChar((PacketBuilder *)local_c8,this->maxweight);
          Send(this,(PacketBuilder *)local_c8);
          PacketBuilder::~PacketBuilder((PacketBuilder *)local_c8);
        }
        std::_List_const_iterator<Character_Item>::_List_const_iterator
                  (&stack0xffffffffffffff28,&local_20);
        local_d0 = (_List_node_base *)
                   std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::erase
                             (&this->inventory,_Stack_d8._M_node);
        local_20._M_node = local_d0;
        std::shared_ptr<Map_Item>::~shared_ptr((shared_ptr<Map_Item> *)local_38);
      }
    }
    CalculateStats(this,true);
    __range1._4_4_ = 0;
    __end1 = std::array<int,_15UL>::begin(&this->paperdoll);
    pvVar7 = std::array<int,_15UL>::end(&this->paperdoll);
    for (; __end1 != pvVar7; __end1 = __end1 + 1) {
      map_item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           *__end1;
      if (((map_item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_ != 0) &&
          (pEVar8 = EIF::Get(this->world->eif,
                             map_item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._4_4_), pEVar8->special != Lore)) &&
         (pEVar8 = EIF::Get(this->world->eif,
                            map_item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi._4_4_), pEVar8->special != Cursed)) {
        Map::AddItem((Map *)local_110,(short)this->player->character->map,
                     (int)(short)map_item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._4_4_,'\x01',this->x,(Character *)(ulong)this->y
                    );
        bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_110);
        if (bVar4) {
          if (it._M_node == (_List_node_base *)0x0) {
            uVar5 = PlayerID(this);
            peVar9 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_110);
            peVar9->owner = uVar5;
            dVar11 = Timer::GetTime();
            pWVar3 = this->world;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&subloc,"ProtectDeathDrop",
                       (allocator<char> *)((long)&builder_2.add_size + 7));
            pmVar10 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                      ::operator[](&(pWVar3->config).
                                    super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                   ,(key_type *)&subloc);
            dVar12 = util::variant::operator_cast_to_double(pmVar10);
            peVar9 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_110);
            peVar9->unprotecttime = dVar11 + dVar12;
            std::__cxx11::string::~string((string *)&subloc);
            std::allocator<char>::~allocator((allocator<char> *)((long)&builder_2.add_size + 7));
          }
          else {
            uVar5 = PlayerID((Character *)it._M_node);
            peVar9 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_110);
            peVar9->owner = uVar5;
            dVar11 = Timer::GetTime();
            pWVar3 = this->world;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_130,"ProtectPKDrop",&local_131);
            pmVar10 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                      ::operator[](&(pWVar3->config).
                                    super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                   ,&local_130);
            dVar12 = util::variant::operator_cast_to_double(pmVar10);
            peVar9 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_110);
            peVar9->unprotecttime = dVar11 + dVar12;
            std::__cxx11::string::~string((string *)&local_130);
            std::allocator<char>::~allocator(&local_131);
          }
          builder_2.add_size._0_4_ = 0;
          if (((__range1._4_4_ == 10) || (__range1._4_4_ == 0xc)) || (__range1._4_4_ == 0xe)) {
            builder_2.add_size._0_4_ = 1;
          }
          bVar4 = Unequip(this->player->character,
                          map_item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi._4_2_,(uchar)builder_2.add_size);
          if (bVar4) {
            PacketBuilder::PacketBuilder
                      ((PacketBuilder *)&builder_1.add_size,PACKET_PAPERDOLL,PACKET_REMOVE,0x2b);
            num = PlayerID(this);
            PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,num);
            PacketBuilder::AddChar((PacketBuilder *)&builder_1.add_size,1);
            PacketBuilder::AddChar((PacketBuilder *)&builder_1.add_size,0);
            AddPaperdollData(this,(PacketBuilder *)&builder_1.add_size,"BAHWS");
            PacketBuilder::AddShort
                      ((PacketBuilder *)&builder_1.add_size,
                       map_item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._4_4_);
            PacketBuilder::AddChar((PacketBuilder *)&builder_1.add_size,(int)builder_2.add_size);
            PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,this->maxhp);
            PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,this->maxtp);
            PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,*this->display_str);
            PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,*this->display_intl);
            PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,*this->display_wis);
            PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,*this->display_agi);
            PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,*this->display_con);
            PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,*this->display_cha);
            PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,this->mindam);
            PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,this->maxdam);
            PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,this->accuracy);
            PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,this->evade);
            PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,this->armor);
            Send(this,(PacketBuilder *)&builder_1.add_size);
            PacketBuilder::~PacketBuilder((PacketBuilder *)&builder_1.add_size);
          }
          DelItem(this->player->character,
                  map_item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._4_2_,1);
          PacketBuilder::PacketBuilder((PacketBuilder *)local_1c0,PACKET_ITEM,PACKET_DROP,0xf);
          PacketBuilder::AddShort
                    ((PacketBuilder *)local_1c0,
                     map_item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi._4_4_);
          PacketBuilder::AddThree((PacketBuilder *)local_1c0,1);
          PacketBuilder::AddInt((PacketBuilder *)local_1c0,0);
          peVar9 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_110);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,(int)peVar9->uid);
          PacketBuilder::AddChar((PacketBuilder *)local_1c0,(uint)this->x);
          PacketBuilder::AddChar((PacketBuilder *)local_1c0,(uint)this->y);
          PacketBuilder::AddChar((PacketBuilder *)local_1c0,this->weight);
          PacketBuilder::AddChar((PacketBuilder *)local_1c0,this->maxweight);
          Send(this,(PacketBuilder *)local_1c0);
          PacketBuilder::~PacketBuilder((PacketBuilder *)local_1c0);
        }
        std::shared_ptr<Map_Item>::~shared_ptr((shared_ptr<Map_Item> *)local_110);
      }
      __range1._4_4_ = __range1._4_4_ + 1;
    }
  }
  return;
}

Assistant:

void Character::DropAll(Character *killer)
{
	if (!CanInteractItems()) return;

	std::list<Character_Item>::iterator it = this->inventory.begin();

	while (it != this->inventory.end())
	{
		if (this->world->eif->Get(it->id).special == EIF::Lore)
		{
			++it;
			continue;
		}

		std::shared_ptr<Map_Item> map_item = this->player->character->map->AddItem(it->id, it->amount, this->x, this->y, 0);

		if (map_item)
		{
			if (killer)
			{
				map_item->owner = killer->PlayerID();
				map_item->unprotecttime = Timer::GetTime() + static_cast<double>(this->world->config["ProtectPKDrop"]);
			}
			else
			{
				map_item->owner = this->PlayerID();
				map_item->unprotecttime = Timer::GetTime() + static_cast<double>(this->world->config["ProtectDeathDrop"]);
			}

			PacketBuilder builder(PACKET_ITEM, PACKET_DROP, 15);
			builder.AddShort(it->id);
			builder.AddThree(it->amount);
			builder.AddInt(0);
			builder.AddShort(map_item->uid);
			builder.AddChar(this->x);
			builder.AddChar(this->y);
			builder.AddChar(this->weight);
			builder.AddChar(this->maxweight);
			this->Send(builder);
		}

		it = this->inventory.erase(it);
	}

	this->CalculateStats();

	int i = 0;
	UTIL_FOREACH(this->paperdoll, id)
	{
		if (id == 0 || this->world->eif->Get(id).special == EIF::Lore || this->world->eif->Get(id).special == EIF::Cursed)
		{
			++i;
			continue;
		}

		std::shared_ptr<Map_Item> map_item = this->player->character->map->AddItem(id, 1, this->x, this->y, 0);

		if (map_item)
		{
			if (killer)
			{
				map_item->owner = killer->PlayerID();
				map_item->unprotecttime = Timer::GetTime() + static_cast<double>(this->world->config["ProtectPKDrop"]);
			}
			else
			{
				map_item->owner = this->PlayerID();
				map_item->unprotecttime = Timer::GetTime() + static_cast<double>(this->world->config["ProtectDeathDrop"]);
			}

			int subloc = 0;

			if (i == Ring2 || i == Armlet2 || i == Bracer2)
			{
				subloc = 1;
			}

			if (this->player->character->Unequip(id, subloc))
			{
				PacketBuilder builder(PACKET_PAPERDOLL, PACKET_REMOVE, 43);
				builder.AddShort(this->PlayerID());
				builder.AddChar(SLOT_CLOTHES);
				builder.AddChar(0); // sound
				this->AddPaperdollData(builder, "BAHWS");
				builder.AddShort(id);
				builder.AddChar(subloc);
				builder.AddShort(this->maxhp);
				builder.AddShort(this->maxtp);
				builder.AddShort(this->display_str);
				builder.AddShort(this->display_intl);
				builder.AddShort(this->display_wis);
				builder.AddShort(this->display_agi);
				builder.AddShort(this->display_con);
				builder.AddShort(this->display_cha);
				builder.AddShort(this->mindam);
				builder.AddShort(this->maxdam);
				builder.AddShort(this->accuracy);
				builder.AddShort(this->evade);
				builder.AddShort(this->armor);
				this->Send(builder);
			}

			this->player->character->DelItem(id, 1);

			PacketBuilder builder(PACKET_ITEM, PACKET_DROP, 15);
			builder.AddShort(id);
			builder.AddThree(1);
			builder.AddInt(0);
			builder.AddShort(map_item->uid);
			builder.AddChar(this->x);
			builder.AddChar(this->y);
			builder.AddChar(this->weight);
			builder.AddChar(this->maxweight);
			this->Send(builder);
		}

		++i;
	}
}